

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv_mu_timeout_stress_test.c
# Opt level: O3

int run_stress_test(cv_stress_data *s,testing t,char *test_name)

{
  ulong uVar1;
  uintmax_t uVar2;
  int iVar3;
  closure *pcVar4;
  char *pcVar5;
  uintmax_t uVar6;
  uintmax_t uVar7;
  int iVar8;
  ulong uVar9;
  nsync_time nVar10;
  nsync_time nVar11;
  
  nsync::nsync_mu_lock(&s->mu);
  nsync::nsync_mu_assert_held(&s->mu);
  if (s->cv_threads_per_value != 0) {
    uVar6 = 0;
    do {
      nsync::nsync_mu_assert_held(&s->mu);
      s->refs = s->refs + 1;
      pcVar4 = (closure *)malloc(0x20);
      pcVar4->f0 = closure_f0_cv_stress_inc_loop;
      pcVar4[1].f0 = cv_stress_inc_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = (_func_void_void_ptr *)0x1;
      closure_fork(pcVar4);
      s->refs = s->refs + 1;
      pcVar4 = (closure *)malloc(0x20);
      pcVar4->f0 = closure_f0_cv_stress_inc_loop;
      pcVar4[1].f0 = cv_stress_inc_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = (_func_void_void_ptr *)0x2;
      closure_fork(pcVar4);
      s->refs = s->refs + 1;
      pcVar4 = (closure *)malloc(0x20);
      pcVar4->f0 = closure_f0_cv_stress_inc_loop;
      pcVar4[1].f0 = cv_stress_inc_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = (_func_void_void_ptr *)0x3;
      closure_fork(pcVar4);
      uVar6 = uVar6 + 1;
    } while (uVar6 != s->cv_threads_per_value);
  }
  if (s->cv_reader_threads_per_value != 0) {
    uVar6 = 0;
    do {
      nsync::nsync_mu_assert_held(&s->mu);
      s->reader_refs = s->reader_refs + 1;
      pcVar4 = (closure *)malloc(0x20);
      pcVar4->f0 = closure_f0_cv_stress_reader_loop;
      pcVar4[1].f0 = cv_stress_reader_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = (_func_void_void_ptr *)0x1;
      closure_fork(pcVar4);
      s->reader_refs = s->reader_refs + 1;
      pcVar4 = (closure *)malloc(0x20);
      pcVar4->f0 = closure_f0_cv_stress_reader_loop;
      pcVar4[1].f0 = cv_stress_reader_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = (_func_void_void_ptr *)0x2;
      closure_fork(pcVar4);
      s->reader_refs = s->reader_refs + 1;
      pcVar4 = (closure *)malloc(0x20);
      pcVar4->f0 = closure_f0_cv_stress_reader_loop;
      pcVar4[1].f0 = cv_stress_reader_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = (_func_void_void_ptr *)0x3;
      closure_fork(pcVar4);
      uVar6 = uVar6 + 1;
    } while (uVar6 != s->cv_reader_threads_per_value);
  }
  if (s->mu_threads_per_value != 0) {
    uVar6 = 0;
    do {
      nsync::nsync_mu_assert_held(&s->mu);
      s->refs = s->refs + 1;
      pcVar4 = (closure *)malloc(0x28);
      pcVar4->f0 = closure_f0_mu_stress_inc_loop;
      pcVar4[1].f0 = mu_stress_inc_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = count_is1mod4;
      pcVar4[4].f0 = (_func_void_void_ptr *)s;
      closure_fork(pcVar4);
      s->refs = s->refs + 1;
      pcVar4 = (closure *)malloc(0x28);
      pcVar4->f0 = closure_f0_mu_stress_inc_loop;
      pcVar4[1].f0 = mu_stress_inc_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = count_is2mod4;
      pcVar4[4].f0 = (_func_void_void_ptr *)s;
      closure_fork(pcVar4);
      s->refs = s->refs + 1;
      pcVar4 = (closure *)malloc(0x28);
      pcVar4->f0 = closure_f0_mu_stress_inc_loop;
      pcVar4[1].f0 = mu_stress_inc_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = count_is3mod4;
      pcVar4[4].f0 = (_func_void_void_ptr *)s;
      closure_fork(pcVar4);
      uVar6 = uVar6 + 1;
    } while (uVar6 != s->mu_threads_per_value);
  }
  if (s->mu_reader_threads_per_value != 0) {
    uVar6 = 0;
    do {
      nsync::nsync_mu_assert_held(&s->mu);
      s->reader_refs = s->reader_refs + 1;
      pcVar4 = (closure *)malloc(0x28);
      pcVar4->f0 = closure_f0_mu_stress_reader_loop;
      pcVar4[1].f0 = mu_stress_reader_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = count_is1mod4or_refs_is0;
      pcVar4[4].f0 = (_func_void_void_ptr *)s;
      closure_fork(pcVar4);
      s->reader_refs = s->reader_refs + 1;
      pcVar4 = (closure *)malloc(0x28);
      pcVar4->f0 = closure_f0_mu_stress_reader_loop;
      pcVar4[1].f0 = mu_stress_reader_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = count_is2mod4or_refs_is0;
      pcVar4[4].f0 = (_func_void_void_ptr *)s;
      closure_fork(pcVar4);
      s->reader_refs = s->reader_refs + 1;
      pcVar4 = (closure *)malloc(0x28);
      pcVar4->f0 = closure_f0_mu_stress_reader_loop;
      pcVar4[1].f0 = mu_stress_reader_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = count_is3mod4or_refs_is0;
      pcVar4[4].f0 = (_func_void_void_ptr *)s;
      closure_fork(pcVar4);
      uVar6 = uVar6 + 1;
    } while (uVar6 != s->mu_reader_threads_per_value);
  }
  nsync::nsync_mu_assert_held(&s->mu);
  nsync::nsync_mu_unlock(&s->mu);
  nVar10 = nsync::nsync_time_ms(1000);
  nVar11.tv_nsec = nVar10.tv_nsec;
  nVar11.tv_sec = nVar11.tv_nsec;
  nsync::nsync_time_sleep((nsync *)nVar10.tv_sec,nVar11);
  nsync::nsync_mu_lock(&s->mu);
  nsync::nsync_mu_assert_held(&s->mu);
  uVar1 = s->timeouts;
  uVar6 = s->cv_threads_per_value;
  uVar2 = s->mu_threads_per_value;
  if (uVar6 != 0) {
    uVar7 = 0;
    do {
      nsync::nsync_mu_assert_held(&s->mu);
      s->refs = s->refs + 1;
      pcVar4 = (closure *)malloc(0x20);
      pcVar4->f0 = closure_f0_cv_stress_inc_loop;
      pcVar4[1].f0 = cv_stress_inc_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = (_func_void_void_ptr *)0x0;
      closure_fork(pcVar4);
      uVar7 = uVar7 + 1;
    } while (uVar7 != s->cv_threads_per_value);
  }
  if (s->cv_reader_threads_per_value != 0) {
    uVar7 = 0;
    do {
      nsync::nsync_mu_assert_held(&s->mu);
      s->reader_refs = s->reader_refs + 1;
      pcVar4 = (closure *)malloc(0x20);
      pcVar4->f0 = closure_f0_cv_stress_reader_loop;
      pcVar4[1].f0 = cv_stress_reader_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = (_func_void_void_ptr *)0x0;
      closure_fork(pcVar4);
      uVar7 = uVar7 + 1;
    } while (uVar7 != s->cv_reader_threads_per_value);
  }
  if (s->mu_threads_per_value != 0) {
    uVar7 = 0;
    do {
      nsync::nsync_mu_assert_held(&s->mu);
      s->refs = s->refs + 1;
      pcVar4 = (closure *)malloc(0x28);
      pcVar4->f0 = closure_f0_mu_stress_inc_loop;
      pcVar4[1].f0 = mu_stress_inc_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = count_is0mod4;
      pcVar4[4].f0 = (_func_void_void_ptr *)s;
      closure_fork(pcVar4);
      uVar7 = uVar7 + 1;
    } while (uVar7 != s->mu_threads_per_value);
  }
  if (s->mu_reader_threads_per_value != 0) {
    uVar7 = 0;
    do {
      nsync::nsync_mu_assert_held(&s->mu);
      s->reader_refs = s->reader_refs + 1;
      pcVar4 = (closure *)malloc(0x28);
      pcVar4->f0 = closure_f0_mu_stress_reader_loop;
      pcVar4[1].f0 = mu_stress_reader_loop;
      pcVar4[2].f0 = (_func_void_void_ptr *)s;
      pcVar4[3].f0 = count_is0mod4or_refs_is0;
      pcVar4[4].f0 = (_func_void_void_ptr *)s;
      closure_fork(pcVar4);
      uVar7 = uVar7 + 1;
    } while (uVar7 != s->mu_reader_threads_per_value);
  }
  nsync::nsync_mu_assert_held(&s->mu);
  if (s->refs != 0) {
    do {
      nsync::nsync_cv_wait(&s->refs_is_zero,&s->mu);
    } while (s->refs != 0);
  }
  if (s->reader_refs != 0) {
    do {
      nsync::nsync_cv_wait(&s->reader_refs_is_zero,&s->mu);
    } while (s->reader_refs != 0);
  }
  nsync::nsync_mu_assert_held(&s->mu);
  nsync::nsync_mu_unlock(&s->mu);
  nVar10 = s->deadline;
  nVar11 = nsync::nsync_time_now();
  iVar3 = nsync::nsync_time_cmp(nVar10,nVar11);
  iVar8 = 0;
  if (iVar3 < 0) {
    uVar9 = (uVar2 + uVar6) * 0x5dc >> 3;
    if (uVar1 < uVar9) {
      iVar3 = testing_is_uniprocessor(t);
      if (iVar3 == 0) {
        pcVar5 = smprintf("%s: expected more than %d timeouts, got %d",test_name,uVar9,uVar1);
        testing_error_(t,1,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O3/cpp/testing/cv_mu_timeout_stress_test.c"
                       ,0x1d3,pcVar5);
      }
    }
    if (s->count != (s->mu_threads_per_value + s->cv_threads_per_value) * s->loop_count * 4) {
      pcVar5 = smprintf("%s: expected to increment s->count to %d, got %d",test_name);
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O3/cpp/testing/cv_mu_timeout_stress_test.c"
                     ,0x1db,pcVar5);
    }
    iVar8 = 1;
    if (s->timeouts < uVar1 + 1) {
      pcVar5 = smprintf("%s: expected more than %d timeouts, got %d",test_name,uVar1 + 1);
      iVar8 = 1;
      testing_error_(t,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]nsync/build_O3/cpp/testing/cv_mu_timeout_stress_test.c"
                     ,0x1e2,pcVar5);
    }
  }
  return iVar8;
}

Assistant:

static int run_stress_test (cv_stress_data *s, testing t,
			    const char *test_name) {
	int done = 0;
	uintmax_t expected_timeouts;
	uintmax_t timeouts_seen;
	uintmax_t expected_count;
	uintmax_t i;
	static const int sleep_seconds = 1;

	nsync_mu_lock (&s->mu);
	nsync_mu_assert_held (&s->mu);
	/* Create threads trying to increment from 1, 2, and 3 mod 4.
	   They will continually hit their timeouts because s.count==0 */
	for (i = 0; i != s->cv_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->refs++;
		closure_fork (closure_cv_stress_inc_loop (&cv_stress_inc_loop, s, 1));
		s->refs++;
		closure_fork (closure_cv_stress_inc_loop (&cv_stress_inc_loop, s, 2));
		s->refs++;
		closure_fork (closure_cv_stress_inc_loop (&cv_stress_inc_loop, s, 3));
	}
	for (i = 0; i != s->cv_reader_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->reader_refs++;
		closure_fork (closure_cv_stress_reader_loop (&cv_stress_reader_loop, s, 1));
		s->reader_refs++;
		closure_fork (closure_cv_stress_reader_loop (&cv_stress_reader_loop, s, 2));
		s->reader_refs++;
		closure_fork (closure_cv_stress_reader_loop (&cv_stress_reader_loop, s, 3));
	}
	for (i = 0; i != s->mu_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->refs++;
		closure_fork (closure_mu_stress_inc_loop (&mu_stress_inc_loop,
							  s, is_n_mod_4[1], s));
		s->refs++;
		closure_fork (closure_mu_stress_inc_loop (&mu_stress_inc_loop,
							  s, is_n_mod_4[2], s));
		s->refs++;
		closure_fork (closure_mu_stress_inc_loop (&mu_stress_inc_loop,
							  s, is_n_mod_4[3], s));
	}
	for (i = 0; i != s->mu_reader_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->reader_refs++;
		closure_fork (closure_mu_stress_reader_loop (&mu_stress_reader_loop,
							     s, is_n_mod_4_or_refs0[1], s));
		s->reader_refs++;
		closure_fork (closure_mu_stress_reader_loop (&mu_stress_reader_loop,
							     s, is_n_mod_4_or_refs0[2], s));
		s->reader_refs++;
		closure_fork (closure_mu_stress_reader_loop (&mu_stress_reader_loop,
							     s, is_n_mod_4_or_refs0[3], s));
	}
	nsync_mu_assert_held (&s->mu);
	nsync_mu_unlock (&s->mu);

	/* Sleep a while to cause many timeouts. */
	nsync_time_sleep (nsync_time_ms (sleep_seconds * 1000));

	nsync_mu_lock (&s->mu);
	nsync_mu_assert_held (&s->mu);

	/* Check that approximately the right number of timeouts have occurred.
	   The 3 below is the three classes of thread produced before the Sleep().
	   The factor of 1/8 is to allow for randomness and slow test machines. */
	expected_timeouts = (s->cv_threads_per_value + s->mu_threads_per_value) * 3 *
			     sleep_seconds * STRESS_EXPECT_TIMEOUTS_PER_SEC / 8;
	timeouts_seen = s->timeouts;
	/* actual check is below. */

	/* Create the threads that increment from 0 mod 4.   s.count will then be incremented. */
	for (i = 0; i != s->cv_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->refs++;
		closure_fork (closure_cv_stress_inc_loop (&cv_stress_inc_loop, s, 0));
	}
	for (i = 0; i != s->cv_reader_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->reader_refs++;
		closure_fork (closure_cv_stress_reader_loop (&cv_stress_reader_loop, s, 0));
	}
	for (i = 0; i != s->mu_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->refs++;
		closure_fork (closure_mu_stress_inc_loop (&mu_stress_inc_loop,
							  s, is_n_mod_4[0], s));
	}
	for (i = 0; i != s->mu_reader_threads_per_value; i++) {
		nsync_mu_assert_held (&s->mu);
		s->reader_refs++;
		closure_fork (closure_mu_stress_reader_loop (&mu_stress_reader_loop,
							     s, is_n_mod_4_or_refs0[0], s));
	}

	/* wait for threads to exit. */
	nsync_mu_assert_held (&s->mu);
	while (s->refs != 0) {
		nsync_cv_wait (&s->refs_is_zero, &s->mu);
	}
	while (s->reader_refs != 0) {
		nsync_cv_wait (&s->reader_refs_is_zero, &s->mu);
	}

	nsync_mu_assert_held (&s->mu);
	nsync_mu_unlock (&s->mu);

	if (nsync_time_cmp (s->deadline, nsync_time_now ()) < 0) {
		if (timeouts_seen < expected_timeouts && !testing_is_uniprocessor (t)) {
			TEST_ERROR (t, ("%s: expected more than %d timeouts, got %d",
				   test_name, expected_timeouts, timeouts_seen));
		}

		/* Check that s.count has the right value. */
		expected_count = s->loop_count * (s->cv_threads_per_value +
						  s->mu_threads_per_value) * 4;
		if (s->count != expected_count) {
			TEST_ERROR (t, ("%s: expected to increment s->count to %d, got %d",
				   test_name, expected_count, s->count));
		}

		/* Some timeouts should have happened while the counts were being incremented. */
		expected_timeouts = timeouts_seen + 1;
		if (s->timeouts < expected_timeouts) {
			TEST_ERROR (t, ("%s: expected more than %d timeouts, got %d",
				   test_name, expected_timeouts, s->timeouts));
		}
		done = 1;
	}
	return (done);
}